

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O3

int luabridge::detail::Invoke<int,void,1>::run<int(*)()>(lua_State *L,_func_int **fn)

{
  int iVar1;
  
  iVar1 = (**fn)();
  lua_pushinteger(L,(long)iVar1);
  return 1;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            Stack<ReturnType>::push(L, FuncTraits<Fn>::call(fn, args));
            return 1;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }